

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O1

void skiwi::store_registers(asmcode *code)

{
  operand local_40 [3];
  operation local_34;
  
  local_34 = MOV;
  local_40[2] = 0x23;
  local_40[1] = 0;
  local_40[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x23;
  local_40[1] = 8;
  local_40[0] = RDI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x23;
  local_40[1] = 0x10;
  local_40[0] = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x23;
  local_40[1] = 0x18;
  local_40[0] = RSP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x23;
  local_40[1] = 0x20;
  local_40[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x23;
  local_40[1] = 0x28;
  local_40[0] = R12;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x23;
  local_40[1] = 0x30;
  local_40[0] = R13;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x23;
  local_40[1] = 0x38;
  local_40[0] = R14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_34 = MOV;
  local_40[2] = 0x23;
  local_40[1] = 0x40;
  local_40[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  return;
}

Assistant:

void store_registers(asmcode& code)
  {
  /*
  linux: r12, r13, r14, r15, rbx, rsp, rbp should be preserved
  windows: r12, r13, r14, r15, rbx, rsp, rbp, rdi, rsi
  */
  code.add(asmcode::MOV, RBX_STORE, asmcode::RBX);
  code.add(asmcode::MOV, RDI_STORE, asmcode::RDI);
  code.add(asmcode::MOV, RSI_STORE, asmcode::RSI);
  code.add(asmcode::MOV, RSP_STORE, asmcode::RSP);
  code.add(asmcode::MOV, RBP_STORE, asmcode::RBP);
  code.add(asmcode::MOV, R12_STORE, asmcode::R12);
  code.add(asmcode::MOV, R13_STORE, asmcode::R13);
  code.add(asmcode::MOV, R14_STORE, asmcode::R14);
  code.add(asmcode::MOV, R15_STORE, asmcode::R15);
  }